

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::checkRuntimeSizable(TParseContext *this,TSourceLoc *loc,TIntermTyped *base)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar4;
  long *plVar5;
  TType *this_00;
  TTypeList *pTVar6;
  undefined4 extraout_var_02;
  
  bVar1 = isRuntimeLength(this,base);
  if (!bVar1) {
    iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
    lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))
                      ((long *)CONCAT44(extraout_var,iVar2));
    if ((*(uint *)(lVar3 + 8) & 0xff80) != 0x2380) {
      iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x58))
                        ((long *)CONCAT44(extraout_var_00,iVar2));
      if ((*(uint *)(lVar3 + 8) & 0x7f) == 6) {
        iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x14])(base);
        plVar5 = (long *)CONCAT44(extraout_var_01,iVar2);
        if ((plVar5 != (long *)0x0) && ((int)plVar5[0x17] == 0x35)) {
          lVar3 = (**(code **)(*plVar5 + 400))(plVar5);
          iVar2 = (**(code **)(*(long *)(lVar3 + 0x20) + 0x38))(lVar3 + 0x20);
          if (iVar2 == 0x12) {
            plVar4 = (long *)(**(code **)(*plVar5 + 0x198))(plVar5);
            lVar3 = (**(code **)(*plVar4 + 0x28))(plVar4);
            iVar2 = **(int **)(*(long *)(lVar3 + 0xc0) + 8);
            plVar5 = (long *)(**(code **)(*plVar5 + 400))(plVar5);
            plVar5 = (long *)(**(code **)(*plVar5 + 0xf0))(plVar5);
            this_00 = (TType *)(**(code **)(*plVar5 + 0xa8))(plVar5);
            pTVar6 = TType::getStruct(this_00);
            if (iVar2 == (int)((ulong)((long)(pTVar6->
                                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                             ).
                                             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pTVar6->
                                            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                            ).
                                            super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 5) + -1) {
              return;
            }
          }
        }
      }
      iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])(base);
      if ((((iVar2 != 0xe) &&
           (iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])(base), iVar2 != 0x11)) &&
          (iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])(base), iVar2 != 0x13)) &&
         (iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])(base), iVar2 != 0x14)) {
        iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])(base);
        if (iVar2 == 0x10) {
          iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
          lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x58))
                            ((long *)CONCAT44(extraout_var_02,iVar2));
          if ((*(uint *)(lVar3 + 8) & 0x7f) - 5 < 2) goto LAB_00396637;
        }
        UNRECOVERED_JUMPTABLE =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        (*UNRECOVERED_JUMPTABLE)
                  (this,loc,"","[",
                   "array must be redeclared with a size before being indexed with a variable",
                   UNRECOVERED_JUMPTABLE);
        return;
      }
LAB_00396637:
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_EXT_nonuniform_qualifier,"variable index");
      return;
    }
  }
  return;
}

Assistant:

void TParseContext::checkRuntimeSizable(const TSourceLoc& loc, const TIntermTyped& base)
{
    // runtime length implies runtime sizeable, so no problem
    if (isRuntimeLength(base))
        return;

    if (base.getType().getQualifier().builtIn == EbvSampleMask)
        return;

    // Check for last member of a bufferreference type, which is runtime sizeable
    // but doesn't support runtime length
    if (base.getType().getQualifier().storage == EvqBuffer) {
        const TIntermBinary* binary = base.getAsBinaryNode();
        if (binary != nullptr &&
            binary->getOp() == EOpIndexDirectStruct &&
            binary->getLeft()->isReference()) {

            const int index = binary->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst();
            const int memberCount = (int)binary->getLeft()->getType().getReferentType()->getStruct()->size();
            if (index == memberCount - 1)
                return;
        }
    }

    // check for additional things allowed by GL_EXT_nonuniform_qualifier
    if (base.getBasicType() == EbtSampler || base.getBasicType() == EbtAccStruct || base.getBasicType() == EbtRayQuery ||
        base.getBasicType() == EbtHitObjectNV || (base.getBasicType() == EbtBlock && base.getType().getQualifier().isUniformOrBuffer()))
        requireExtensions(loc, 1, &E_GL_EXT_nonuniform_qualifier, "variable index");
    else
        error(loc, "", "[", "array must be redeclared with a size before being indexed with a variable");
}